

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O1

void __thiscall glslang::TProcesses::addArgument(TProcesses *this,int arg)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint __val;
  uint __len;
  string argString;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::append
            ((char *)((this->processes).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
  __val = -arg;
  if (0 < arg) {
    __val = arg;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_003ddf31;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_003ddf31;
      }
      if (uVar2 < 10000) goto LAB_003ddf31;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_003ddf31:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(arg >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)arg >> 0x1f) + (long)local_50[0]),__len,__val);
  std::__cxx11::string::_M_append
            ((char *)((this->processes).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void addArgument(int arg)
    {
        processes.back().append(" ");
        std::string argString = std::to_string(arg);
        processes.back().append(argString);
    }